

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.h
# Opt level: O2

void __thiscall
Js::JavascriptPromiseCapability::JavascriptPromiseCapability
          (JavascriptPromiseCapability *this,Var promise,Var resolve,Var reject)

{
  (this->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_013cbfe8;
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->promise,promise);
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->resolve,resolve);
  Memory::WriteBarrierPtr<void>::WriteBarrierSet(&this->reject,reject);
  return;
}

Assistant:

JavascriptPromiseCapability(Var promise, Var resolve, Var reject)
            : promise(promise), resolve(resolve), reject(reject)
        { }